

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac_seek_to_pcm_frame(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  ma_dr_flac_frame *header;
  ma_dr_flac_bs *bs;
  ulong pcmFrameIndex_00;
  ma_dr_flac_oggbs *oggbs;
  bool bVar1;
  byte bVar2;
  ma_uint32 mVar3;
  uint uVar4;
  ma_bool32 mVar5;
  ma_bool32 mVar6;
  ma_result mVar7;
  ma_uint64 mVar8;
  ma_uint64 mVar9;
  bool bVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong local_38;
  
  if (pFlac == (ma_dr_flac *)0x0) {
    return 0;
  }
  bs = &pFlac->bs;
  header = &pFlac->currentFLACFrame;
  bVar1 = false;
LAB_0016c6d7:
  bVar10 = bVar1;
  pcmFrameIndex_00 = pFlac->currentPCMFrame;
  if (pcmFrameIndex_00 == pcmFrameIndex) {
    mVar5 = 1;
    goto LAB_0016c9e3;
  }
  mVar8 = pFlac->firstFLACFramePosInBytes;
  if (mVar8 == 0) {
    mVar5 = 0;
    goto LAB_0016c9e3;
  }
  if (pcmFrameIndex == 0) {
    pFlac->currentPCMFrame = 0;
    mVar5 = ma_dr_flac__seek_to_byte(bs,mVar8);
    memset(header,0,0xa8);
    goto LAB_0016c9e3;
  }
  if (pFlac->totalPCMFrameCount < pcmFrameIndex) {
    pcmFrameIndex = pFlac->totalPCMFrameCount;
  }
  if (pcmFrameIndex_00 < pcmFrameIndex) {
    uVar11 = (int)pcmFrameIndex - (int)pcmFrameIndex_00;
    uVar4 = (pFlac->currentFLACFrame).pcmFramesRemaining;
    mVar3 = uVar4 - uVar11;
    if (uVar11 <= uVar4 && mVar3 != 0) {
      (pFlac->currentFLACFrame).pcmFramesRemaining = mVar3;
LAB_0016c9c2:
      pFlac->currentPCMFrame = pcmFrameIndex;
      mVar5 = 1;
      goto LAB_0016c9e3;
    }
  }
  else {
    uVar4 = (int)pcmFrameIndex_00 - (int)pcmFrameIndex;
    mVar3 = (pFlac->currentFLACFrame).pcmFramesRemaining;
    if (uVar4 < (pFlac->currentFLACFrame).header.blockSizeInPCMFrames - mVar3) {
      (pFlac->currentFLACFrame).pcmFramesRemaining = mVar3 + uVar4;
      goto LAB_0016c9c2;
    }
  }
  if (pFlac->container == ma_dr_flac_container_ogg) {
    oggbs = (ma_dr_flac_oggbs *)pFlac->_oggbs;
    mVar9 = oggbs->currentBytePos;
    mVar5 = ma_dr_flac__seek_to_byte(bs,mVar8);
    if (mVar5 != 0) {
      oggbs->bytesRemainingInPage = 0;
      mVar5 = ma_dr_flac_oggbs__goto_next_page(oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch);
      if (mVar5 != 0) {
        local_38 = 0;
        do {
          uVar14 = (oggbs->currentPageHeader).granulePosition;
          if (pcmFrameIndex <= uVar14) {
            mVar5 = ma_dr_flac_oggbs__seek_physical
                              (oggbs,(oggbs->currentBytePos -
                                     ((ulong)oggbs->pageDataSize +
                                     (ulong)(oggbs->currentPageHeader).segmentCount)) - 0x1b,
                               ma_dr_flac_seek_origin_start);
            if ((mVar5 == 0) ||
               (mVar5 = ma_dr_flac_oggbs__goto_next_page
                                  (oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch), mVar5 == 0))
            goto LAB_0016c850;
            goto LAB_0016c8ad;
          }
          if ((((((oggbs->currentPageHeader).headerType & 1) == 0) &&
               (1 < (oggbs->currentPageHeader).segmentTable[0])) && (oggbs->pageData[0] == 0xff)) &&
             ((oggbs->pageData[1] & 0xfc) == 0xf8)) {
            local_38 = uVar14;
          }
          mVar5 = ma_dr_flac_oggbs__goto_next_page(oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch);
        } while (mVar5 != 0);
      }
      ma_dr_flac_oggbs__seek_physical(oggbs,mVar9,ma_dr_flac_seek_origin_start);
    }
    goto LAB_0016c850;
  }
  bVar2 = pFlac->field_0x128;
  if ((bVar2 & 1) == 0) {
    mVar5 = ma_dr_flac__seek_to_pcm_frame__seek_table(pFlac,pcmFrameIndex);
    if (mVar5 == 0) {
      bVar2 = pFlac->field_0x128;
      goto LAB_0016c805;
    }
LAB_0016c9d7:
    mVar5 = 1;
LAB_0016c9dc:
    pFlac->currentPCMFrame = pcmFrameIndex;
    goto LAB_0016c9e3;
  }
LAB_0016c805:
  if (((bVar2 & 2) == 0) && (pFlac->totalPCMFrameCount != 0)) {
    mVar5 = ma_dr_flac__seek_to_pcm_frame__binary_search(pFlac,pcmFrameIndex);
    if (mVar5 != 0) goto LAB_0016c9d7;
    bVar2 = pFlac->field_0x128;
  }
  if ((bVar2 & 4) == 0) {
    mVar5 = ma_dr_flac__seek_to_pcm_frame__brute_force(pFlac,pcmFrameIndex);
LAB_0016c83a:
    if (mVar5 != 0) goto LAB_0016c9dc;
  }
LAB_0016c850:
  mVar6 = ma_dr_flac_seek_to_pcm_frame(pFlac,pcmFrameIndex_00);
  pcmFrameIndex = 0;
  mVar5 = 0;
  bVar1 = true;
  if (mVar6 != 0) {
LAB_0016c9e3:
    if (bVar10) {
      return 0;
    }
    return mVar5;
  }
  goto LAB_0016c6d7;
  while ((mVar7 = ma_dr_flac__seek_flac_frame(pFlac), mVar7 == MA_SUCCESS ||
         (local_38 = uVar14, mVar7 == MA_CRC_MISMATCH))) {
LAB_0016c8ad:
    uVar14 = local_38;
    mVar5 = ma_dr_flac__read_next_flac_frame_header(bs,pFlac->bitsPerSample,&header->header);
    if (mVar5 == 0) break;
    mVar8 = (header->header).pcmFrameNumber;
    if (mVar8 == 0) {
      mVar8 = (ulong)pFlac->maxBlockSizeInPCMFrames *
              (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
    }
    lVar12 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar8;
    lVar13 = 0;
    if (lVar12 != 0) {
      lVar13 = lVar12 + -1;
    }
    local_38 = (uVar14 - mVar8) + lVar13 + 1;
    if ((pFlac->totalPCMFrameCount == pcmFrameIndex) && (local_38 == pFlac->totalPCMFrameCount)) {
      mVar7 = ma_dr_flac__decode_flac_frame(pFlac);
      if (mVar7 == MA_SUCCESS) {
        (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
        goto LAB_0016c9d7;
      }
      break;
    }
    if (pcmFrameIndex < local_38) {
      mVar7 = ma_dr_flac__decode_flac_frame(pFlac);
      local_38 = uVar14;
      if (mVar7 != MA_CRC_MISMATCH) {
        if (mVar7 == MA_SUCCESS) {
          mVar8 = pcmFrameIndex - uVar14;
          if (mVar8 == 0) goto LAB_0016c9d7;
          pFlac->currentPCMFrame = uVar14;
          mVar9 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,mVar8);
          mVar5 = (ma_bool32)(mVar9 == mVar8);
          goto LAB_0016c83a;
        }
        break;
      }
      goto LAB_0016c8ad;
    }
  }
  goto LAB_0016c850;
}

Assistant:

MA_API ma_bool32 ma_dr_flac_seek_to_pcm_frame(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    if (pFlac == NULL) {
        return MA_FALSE;
    }
    if (pFlac->currentPCMFrame == pcmFrameIndex) {
        return MA_TRUE;
    }
    if (pFlac->firstFLACFramePosInBytes == 0) {
        return MA_FALSE;
    }
    if (pcmFrameIndex == 0) {
        pFlac->currentPCMFrame = 0;
        return ma_dr_flac__seek_to_first_frame(pFlac);
    } else {
        ma_bool32 wasSuccessful = MA_FALSE;
        ma_uint64 originalPCMFrame = pFlac->currentPCMFrame;
        if (pcmFrameIndex > pFlac->totalPCMFrameCount) {
            pcmFrameIndex = pFlac->totalPCMFrameCount;
        }
        if (pcmFrameIndex > pFlac->currentPCMFrame) {
            ma_uint32 offset = (ma_uint32)(pcmFrameIndex - pFlac->currentPCMFrame);
            if (pFlac->currentFLACFrame.pcmFramesRemaining >  offset) {
                pFlac->currentFLACFrame.pcmFramesRemaining -= offset;
                pFlac->currentPCMFrame = pcmFrameIndex;
                return MA_TRUE;
            }
        } else {
            ma_uint32 offsetAbs = (ma_uint32)(pFlac->currentPCMFrame - pcmFrameIndex);
            ma_uint32 currentFLACFramePCMFrameCount = pFlac->currentFLACFrame.header.blockSizeInPCMFrames;
            ma_uint32 currentFLACFramePCMFramesConsumed = currentFLACFramePCMFrameCount - pFlac->currentFLACFrame.pcmFramesRemaining;
            if (currentFLACFramePCMFramesConsumed > offsetAbs) {
                pFlac->currentFLACFrame.pcmFramesRemaining += offsetAbs;
                pFlac->currentPCMFrame = pcmFrameIndex;
                return MA_TRUE;
            }
        }
#ifndef MA_DR_FLAC_NO_OGG
        if (pFlac->container == ma_dr_flac_container_ogg)
        {
            wasSuccessful = ma_dr_flac_ogg__seek_to_pcm_frame(pFlac, pcmFrameIndex);
        }
        else
#endif
        {
            if (!pFlac->_noSeekTableSeek) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__seek_table(pFlac, pcmFrameIndex);
            }
#if !defined(MA_DR_FLAC_NO_CRC)
            if (!wasSuccessful && !pFlac->_noBinarySearchSeek && pFlac->totalPCMFrameCount > 0) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__binary_search(pFlac, pcmFrameIndex);
            }
#endif
            if (!wasSuccessful && !pFlac->_noBruteForceSeek) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__brute_force(pFlac, pcmFrameIndex);
            }
        }
        if (wasSuccessful) {
            pFlac->currentPCMFrame = pcmFrameIndex;
        } else {
            if (ma_dr_flac_seek_to_pcm_frame(pFlac, originalPCMFrame) == MA_FALSE) {
                ma_dr_flac_seek_to_pcm_frame(pFlac, 0);
            }
        }
        return wasSuccessful;
    }
}